

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

void __thiscall
SkylineBinPack::SkylineBinPack(SkylineBinPack *this,int width,int height,bool useWasteMap)

{
  bool useWasteMap_local;
  int height_local;
  int width_local;
  SkylineBinPack *this_local;
  
  DisjointRectCollection::DisjointRectCollection(&this->disjointRects);
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::TArray(&this->skyLine);
  GuillotineBinPack::GuillotineBinPack(&this->wasteMap);
  Init(this,width,height,useWasteMap);
  return;
}

Assistant:

SkylineBinPack::SkylineBinPack(int width, int height, bool useWasteMap)
{
	Init(width, height, useWasteMap);
}